

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::increase_size(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t maxNumElementsAllowed;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  if (this->mMask == 0) {
    init_data(this,8);
  }
  else {
    sVar2 = calcMaxNumElementsAllowed(this,this->mMask + 1);
    if ((sVar2 <= this->mNumElements) || (bVar1 = try_increase_info(this), !bVar1)) {
      sVar2 = this->mNumElements;
      sVar3 = calcMaxNumElementsAllowed(this,this->mMask + 1);
      if (sVar2 << 1 < sVar3) {
        throwOverflowError(this);
      }
      rehashPowerOfTwo(this,(this->mMask + 1) * 2);
    }
  }
  return;
}

Assistant:

void increase_size() {
        // nothing allocated yet? just allocate InitialNumElements
        if (0 == mMask) {
            init_data(InitialNumElements);
            return;
        }

        auto const maxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        if (mNumElements < maxNumElementsAllowed && try_increase_info()) {
            return;
        }

        ROBIN_HOOD_LOG("mNumElements=" << mNumElements << ", maxNumElementsAllowed="
                                       << maxNumElementsAllowed << ", load="
                                       << (static_cast<double>(mNumElements) * 100.0 /
                                           (static_cast<double>(mMask) + 1)))
        // it seems we have a really bad hash function! don't try to resize again
        if (mNumElements * 2 < calcMaxNumElementsAllowed(mMask + 1)) {
            throwOverflowError();
        }

        rehashPowerOfTwo((mMask + 1) * 2);
    }